

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_im2col_gemm_int8.h
# Opt level: O0

void ncnn::convolution_im2col_gemm_transform_kernel_int8
               (Mat *kernel,Mat *AT,int inch,int outch,int kernel_w,int kernel_h,Option *opt)

{
  long *plVar1;
  int iVar2;
  int *piVar3;
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  long in_stack_00000008;
  Mat AT_tile;
  int max_kk;
  int k_1;
  int max_ii;
  int i_1;
  int ppj;
  int w_shift_count;
  bool has_w_shift;
  char *k00;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat weight_data_r2;
  Mat A_data;
  int elempack;
  int nn_M;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  int K;
  int M;
  int maxk;
  Mat *m_1;
  Mat *m;
  undefined8 uVar4;
  int in_stack_fffffffffffff9b0;
  int in_stack_fffffffffffff9b4;
  Mat *in_stack_fffffffffffff9b8;
  void **ppvVar5;
  undefined4 in_stack_fffffffffffff9c0;
  int in_stack_fffffffffffff9c4;
  size_t in_stack_fffffffffffff9c8;
  undefined8 *puVar6;
  size_t in_stack_fffffffffffff9d0;
  undefined8 in_stack_fffffffffffff9d8;
  Mat *in_stack_fffffffffffff9e0;
  undefined4 in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa04;
  undefined4 in_stack_fffffffffffffa08;
  undefined4 in_stack_fffffffffffffa0c;
  undefined4 in_stack_fffffffffffffa10;
  undefined4 in_stack_fffffffffffffa14;
  bool local_5e5;
  int in_stack_fffffffffffffa1c;
  int in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa24;
  int in_stack_fffffffffffffa30;
  Allocator *in_stack_fffffffffffffa40;
  Allocator *in_stack_fffffffffffffa48;
  undefined8 in_stack_fffffffffffffa50;
  Mat *in_stack_fffffffffffffa58;
  undefined8 local_578;
  undefined8 local_570;
  undefined8 local_568;
  undefined4 local_560;
  long *local_558;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  Allocator *in_stack_fffffffffffffac0;
  undefined8 in_stack_fffffffffffffac8;
  int iVar7;
  int in_stack_fffffffffffffad0;
  int in_stack_fffffffffffffad4;
  void *__ptr;
  Mat *in_stack_fffffffffffffad8;
  int local_4e4;
  int local_4e0;
  int local_4dc;
  int local_4d8;
  int local_4d4;
  int local_4d0;
  int local_4cc;
  undefined4 local_4c8;
  bool local_4c1;
  undefined8 local_4c0;
  undefined8 local_4b8;
  undefined4 local_498;
  undefined4 local_48c;
  undefined8 local_480;
  void *local_478;
  int local_46c;
  int local_468;
  int local_464;
  undefined1 *local_460;
  int local_454;
  void *local_450;
  int *local_448;
  long local_440;
  undefined4 local_438;
  long *local_430;
  undefined4 local_428;
  int local_424;
  int local_420;
  undefined4 local_41c;
  undefined4 local_418;
  long local_410;
  void *local_3f8;
  int *local_3f0;
  undefined8 local_3e8;
  undefined4 local_3e0;
  long *local_3d8;
  undefined4 local_3d0;
  undefined4 local_3cc;
  undefined4 local_3c8;
  undefined4 local_3c4;
  undefined4 local_3c0;
  undefined8 local_3b8;
  void *local_3b0;
  int *local_3a8;
  void *local_3a0;
  undefined4 local_398;
  long *local_390;
  undefined4 local_388;
  int local_384;
  undefined4 local_380;
  undefined4 local_37c;
  undefined4 local_378;
  void *local_370;
  int local_368;
  int local_364;
  int local_360 [2];
  int local_358;
  int local_354;
  int local_350;
  int local_34c;
  int local_340;
  int local_33c;
  long *local_338;
  void **local_328;
  void **local_320;
  undefined8 *local_310;
  void **local_300;
  undefined8 *local_2f0;
  undefined8 *local_2e0;
  void **local_2d0;
  int local_2c0;
  undefined4 local_2bc;
  void **local_2b8;
  void **local_2b0;
  void **local_2a8;
  int local_2a0;
  undefined4 local_29c;
  void **local_298;
  int local_280;
  undefined4 local_27c;
  void **local_278;
  int local_260;
  undefined4 local_25c;
  undefined8 *local_258;
  undefined8 *local_238;
  int local_220;
  undefined4 local_21c;
  void **local_218;
  undefined8 *local_1f8;
  int local_1e0;
  undefined4 local_1dc;
  void **local_1d8;
  undefined1 local_1cd;
  int local_1cc;
  undefined8 *local_1c0;
  undefined1 local_19d;
  int local_19c;
  void **local_198;
  undefined8 *local_190;
  void *local_120;
  void *local_110;
  void *local_100;
  undefined4 local_f8;
  int local_f4;
  undefined8 *local_f0;
  undefined1 *local_e8;
  long *local_e0;
  undefined4 local_d4;
  long local_d0;
  void *local_c8;
  undefined4 local_c0;
  int local_bc;
  undefined1 *local_b8;
  int local_ac;
  void **local_a8;
  int local_9c;
  undefined8 *local_98;
  void *local_78;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  long local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  iVar7 = (int)((ulong)in_stack_fffffffffffffac8 >> 0x20);
  local_34c = in_R8D * in_R9D;
  local_354 = in_EDX * local_34c;
  local_350 = in_ECX;
  local_340 = in_ECX;
  local_33c = in_EDX;
  local_338 = in_RSI;
  convolution_im2col_gemm_get_optimal_tile_mnk_int8
            (in_stack_fffffffffffffa24,in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,
             (int *)CONCAT44(in_stack_fffffffffffffa14,in_stack_fffffffffffffa10),
             (int *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
             (int *)CONCAT44(in_stack_fffffffffffffa04,in_stack_fffffffffffffa00),
             in_stack_fffffffffffffa30);
  local_364 = (local_350 + local_358 + -1) / local_358;
  local_368 = 1;
  if (((*(byte *)(in_stack_00000008 + 0x27) & 1) != 0) && (local_368 = 1, local_33c % 8 == 0)) {
    local_368 = 8;
  }
  local_328 = &local_3b0;
  local_3b0 = (void *)0x0;
  local_3a8 = (int *)0x0;
  local_3a0 = (void *)0x0;
  local_398 = 0;
  local_390 = (long *)0x0;
  local_388 = 0;
  local_384 = 0;
  local_380 = 0;
  local_37c = 0;
  local_378 = 0;
  local_370 = (void *)0x0;
  if (local_34c == 1) {
    Mat::reshape(in_stack_fffffffffffffa58,(int)((ulong)in_stack_fffffffffffffa50 >> 0x20),
                 (int)in_stack_fffffffffffffa50,in_stack_fffffffffffffa48);
    iVar7 = (int)(in_stack_fffffffffffff9d0 >> 0x20);
    local_2b8 = &local_3f8;
    local_2b0 = &local_3b0;
    if (&local_3b0 != local_2b8) {
      if (local_3f0 != (int *)0x0) {
        local_2bc = 1;
        LOCK();
        local_2c0 = *local_3f0;
        *local_3f0 = *local_3f0 + 1;
        UNLOCK();
      }
      local_298 = &local_3b0;
      if (local_3a8 != (int *)0x0) {
        local_29c = 0xffffffff;
        LOCK();
        local_2a0 = *local_3a8;
        *local_3a8 = *local_3a8 + -1;
        UNLOCK();
        if (local_2a0 == 1) {
          if (local_390 == (long *)0x0) {
            local_100 = local_3b0;
            if (local_3b0 != (void *)0x0) {
              free(local_3b0);
            }
          }
          else {
            (**(code **)(*local_390 + 0x18))(local_390,local_3b0);
          }
        }
      }
      local_3b0 = (void *)0x0;
      local_3a0 = (void *)0x0;
      local_398 = 0;
      local_388 = 0;
      local_384 = 0;
      local_380 = 0;
      local_37c = 0;
      local_378 = 0;
      local_370 = (void *)0x0;
      local_3a8 = (int *)0x0;
      local_3b0 = *local_2b8;
      local_3a8 = (int *)local_2b8[1];
      local_3a0 = local_2b8[2];
      local_398 = *(undefined4 *)(local_2b8 + 3);
      local_390 = (long *)local_2b8[4];
      local_388 = *(undefined4 *)(local_2b8 + 5);
      local_384 = *(int *)((long)local_2b8 + 0x2c);
      local_380 = *(undefined4 *)(local_2b8 + 6);
      local_37c = *(undefined4 *)((long)local_2b8 + 0x34);
      local_378 = *(undefined4 *)(local_2b8 + 7);
      local_370 = local_2b8[8];
    }
    local_320 = &local_3f8;
    local_2a8 = &local_3b0;
    local_1d8 = local_320;
    if (local_3f0 != (int *)0x0) {
      local_1dc = 0xffffffff;
      LOCK();
      local_1e0 = *local_3f0;
      *local_3f0 = *local_3f0 + -1;
      UNLOCK();
      if (local_1e0 == 1) {
        if (local_3d8 == (long *)0x0) {
          if (local_3f8 != (void *)0x0) {
            free(local_3f8);
          }
        }
        else {
          (**(code **)(*local_3d8 + 0x18))(local_3d8,local_3f8);
        }
      }
    }
    local_3f8 = (void *)0x0;
    local_3e8 = 0;
    local_3e0 = 0;
    local_3d0 = 0;
    local_3cc = 0;
    local_3c8 = 0;
    local_3c4 = 0;
    local_3c0 = 0;
    local_3b8 = 0;
    local_3f0 = (int *)0x0;
  }
  else {
    Mat::reshape(in_stack_fffffffffffffad8,in_stack_fffffffffffffad4,in_stack_fffffffffffffad0,iVar7
                 ,in_stack_fffffffffffffac0);
    Mat::create(in_stack_fffffffffffff9e0,(int)((ulong)in_stack_fffffffffffff9d8 >> 0x20),
                (int)in_stack_fffffffffffff9d8,in_stack_fffffffffffff9d0,
                (int)(in_stack_fffffffffffff9c8 >> 0x20),
                (Allocator *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0));
    for (local_454 = 0; iVar7 = (int)(in_stack_fffffffffffff9d0 >> 0x20), local_454 < local_340;
        local_454 = local_454 + 1) {
      local_a8 = &local_3b0;
      local_ac = local_454;
      local_460 = (undefined1 *)
                  ((long)local_3b0 + (long)local_384 * (long)local_454 * (long)local_3a0);
      for (local_464 = 0; local_464 + local_368 + -1 < local_33c; local_464 = local_368 + local_464)
      {
        for (local_468 = 0; local_468 < local_34c; local_468 = local_468 + 1) {
          for (local_46c = 0; local_46c < local_368; local_46c = local_46c + 1) {
            local_190 = &local_4c0;
            local_198 = &local_450;
            local_78 = (void *)((long)local_450 + local_410 * local_454 * local_440);
            local_60 = &local_4c0;
            local_8 = (long)local_424 * (long)local_420 * local_440;
            local_9c = local_464 + local_46c;
            local_98 = &local_4c0;
            local_478 = (void *)((long)local_78 + (long)local_424 * (long)local_9c * local_440);
            local_310 = &local_4c0;
            local_c = 0x10;
            local_19c = local_454;
            local_19d = 1;
            local_4c0 = 0;
            local_498 = 0;
            local_48c = 0;
            local_480 = 0;
            local_4b8 = 0;
            *local_460 = *(undefined1 *)((long)local_478 + (long)local_468);
            local_460 = local_460 + 1;
            local_1f8 = local_310;
          }
        }
      }
    }
    local_300 = &local_450;
    local_218 = local_300;
    if (local_448 != (int *)0x0) {
      local_21c = 0xffffffff;
      LOCK();
      local_220 = *local_448;
      *local_448 = *local_448 + -1;
      UNLOCK();
      if (local_220 == 1) {
        if (local_430 == (long *)0x0) {
          if (local_450 != (void *)0x0) {
            free(local_450);
          }
        }
        else {
          (**(code **)(*local_430 + 0x18))(local_430,local_450);
        }
      }
    }
    local_450 = (void *)0x0;
    local_440 = 0;
    local_438 = 0;
    local_428 = 0;
    local_424 = 0;
    local_420 = 0;
    local_41c = 0;
    local_418 = 0;
    local_410 = 0;
    local_448 = (int *)0x0;
  }
  local_4c1 = false;
  if (3 < local_360[0]) {
    iVar2 = cpu_support_x86_avx512_vnni();
    local_5e5 = true;
    if (iVar2 == 0) {
      iVar2 = cpu_support_x86_avx_vnni();
      local_5e5 = iVar2 != 0;
    }
    local_4c1 = local_5e5;
    iVar2 = cpu_support_x86_avx_vnni_int8();
    if (iVar2 != 0) {
      local_4c1 = false;
    }
  }
  iVar2 = (int)((ulong)in_stack_fffffffffffff9d8 >> 0x20);
  if ((local_4c1 & 1U) == 0) {
    uVar4 = 0;
    Mat::create(in_stack_fffffffffffff9e0,iVar2,(int)in_stack_fffffffffffff9d8,iVar7,
                in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffffa40);
  }
  else {
    if (local_358 < 0x10) {
      if (local_358 < 8) {
        if (local_358 < 4) {
          local_4c8 = 1;
          if (1 < local_358) {
            local_4c8 = 2;
          }
        }
        else {
          local_4c8 = 4;
        }
      }
      else {
        local_4c8 = 8;
      }
    }
    else {
      local_4c8 = 0x10;
    }
    uVar4 = 0;
    Mat::create(in_stack_fffffffffffff9e0,iVar2,(int)in_stack_fffffffffffff9d8,iVar7,
                in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c4,in_stack_fffffffffffffa40);
  }
  for (local_4cc = 0; local_4cc < local_364; local_4cc = local_4cc + 1) {
    local_4d0 = local_4cc * local_358;
    local_4d8 = local_350 - local_4d0;
    piVar3 = std::min<int>(&local_4d8,&local_358);
    local_4d4 = *piVar3;
    for (local_4dc = 0; local_4dc < local_354; local_4dc = local_360[0] + local_4dc) {
      local_4e4 = local_354 - local_4dc;
      piVar3 = std::min<int>(&local_4e4,local_360);
      local_4e0 = *piVar3;
      local_1cc = local_4d0 / local_358;
      local_1c0 = &local_578;
      local_bc = *(int *)((long)local_338 + 0x2c);
      local_30 = (int)local_338[6];
      local_34 = *(undefined4 *)((long)local_338 + 0x34);
      local_40 = *local_338 + local_338[8] * (long)local_1cc * local_338[2];
      local_d0 = local_338[2];
      local_d4 = (undefined4)local_338[3];
      plVar1 = (long *)local_338[4];
      local_28 = &local_578;
      local_18 = (long)local_bc * (long)local_30 * local_d0;
      local_f4 = local_4dc / local_360[0];
      local_e8 = &stack0xfffffffffffffad0;
      local_f0 = &local_578;
      local_c8 = (void *)(local_40 + (long)local_bc * (long)local_f4 * local_d0);
      local_b8 = &stack0xfffffffffffffad0;
      local_2f0 = &local_578;
      local_1c = 0x10;
      local_c0 = 1;
      local_f8 = 1;
      local_1cd = 1;
      piVar3 = (int *)0x0;
      local_578 = 0;
      local_568 = 0;
      local_560 = 0;
      local_550 = 0;
      local_54c = 0;
      local_548 = 0;
      local_544 = 0;
      local_570 = 0;
      local_238 = local_2f0;
      local_e0 = plVar1;
      local_58 = plVar1;
      local_4c = local_d4;
      local_48 = local_d0;
      local_2c = local_bc;
      local_558 = plVar1;
      __ptr = local_c8;
      convolution_im2col_pack_A_tile_int8
                ((Mat *)CONCAT44(in_stack_fffffffffffff9c4,in_stack_fffffffffffff9c0),
                 in_stack_fffffffffffff9b8,in_stack_fffffffffffff9b4,in_stack_fffffffffffff9b0,
                 (int)((ulong)uVar4 >> 0x20),(int)uVar4);
      puVar6 = (undefined8 *)&stack0xfffffffffffffad0;
      local_2e0 = puVar6;
      local_258 = puVar6;
      if (piVar3 != (int *)0x0) {
        local_25c = 0xffffffff;
        LOCK();
        local_260 = *piVar3;
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (local_260 == 1) {
          if (plVar1 == (long *)0x0) {
            local_120 = __ptr;
            if (__ptr != (void *)0x0) {
              free(__ptr);
            }
          }
          else {
            (**(code **)(*plVar1 + 0x18))(plVar1,__ptr);
          }
        }
      }
      *puVar6 = 0;
      puVar6[2] = 0;
      *(undefined4 *)(puVar6 + 3) = 0;
      *(undefined4 *)(puVar6 + 5) = 0;
      *(undefined4 *)((long)puVar6 + 0x2c) = 0;
      *(undefined4 *)(puVar6 + 6) = 0;
      *(undefined4 *)((long)puVar6 + 0x34) = 0;
      *(undefined4 *)(puVar6 + 7) = 0;
      puVar6[8] = 0;
      puVar6[1] = 0;
    }
  }
  ppvVar5 = &local_3b0;
  if (local_3a8 != (int *)0x0) {
    local_27c = 0xffffffff;
    LOCK();
    local_280 = *local_3a8;
    *local_3a8 = *local_3a8 + -1;
    UNLOCK();
    if (local_280 == 1) {
      local_2d0 = ppvVar5;
      local_278 = ppvVar5;
      if (local_390 == (long *)0x0) {
        local_110 = local_3b0;
        if (local_3b0 != (void *)0x0) {
          free(local_3b0);
        }
      }
      else {
        (**(code **)(*local_390 + 0x18))(local_390,local_3b0);
      }
    }
  }
  *ppvVar5 = (void *)0x0;
  ppvVar5[2] = (void *)0x0;
  *(undefined4 *)(ppvVar5 + 3) = 0;
  *(undefined4 *)(ppvVar5 + 5) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x2c) = 0;
  *(undefined4 *)(ppvVar5 + 6) = 0;
  *(undefined4 *)((long)ppvVar5 + 0x34) = 0;
  *(undefined4 *)(ppvVar5 + 7) = 0;
  ppvVar5[8] = (void *)0x0;
  ppvVar5[1] = (void *)0x0;
  return;
}

Assistant:

static void convolution_im2col_gemm_transform_kernel_int8(const Mat& kernel, Mat& AT, int inch, int outch, int kernel_w, int kernel_h, const Option& opt)
{
    // NCNN_LOGE("convolution_im2col_gemm_transform_kernel_int8");
    const int maxk = kernel_w * kernel_h;

    const int M = outch;
    const int K = inch * maxk;

    int TILE_M, TILE_N, TILE_K;
    convolution_im2col_gemm_get_optimal_tile_mnk_int8(M, 0, K, TILE_M, TILE_N, TILE_K, opt.num_threads);

    const int nn_M = (M + TILE_M - 1) / TILE_M;

    int elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
        elempack = inch % 8 == 0 ? 8 : 1;
    }
#endif // __SSE2__

    // maxk-inch-outch to pa-maxk-inch/pa-outch
    Mat A_data;
    if (maxk == 1)
    {
        A_data = kernel.reshape(maxk * inch, outch);
    }
    else
    {
        Mat weight_data_r2 = kernel.reshape(maxk, inch, outch);

        A_data.create(maxk * inch, outch, (size_t)1u, 1);

        for (int q = 0; q < outch; q += 1)
        {
            signed char* g00 = A_data.row<signed char>(q);

            for (int p = 0; p + (elempack - 1) < inch; p += elempack)
            {
                for (int k = 0; k < maxk; k++)
                {
                    for (int i = 0; i < elempack; i++)
                    {
                        const signed char* k00 = weight_data_r2.channel(q).row<const signed char>(p + i);
                        g00[0] = k00[k];
                        g00++;
                    }
                }
            }
        }
    }

#if NCNN_AVX512VNNI || NCNN_AVXVNNI
    bool has_w_shift = false;
    if (TILE_K >= 4)
    {
        has_w_shift = ncnn::cpu_support_x86_avx512_vnni() || ncnn::cpu_support_x86_avx_vnni();
#if NCNN_AVXVNNIINT8
        if (ncnn::cpu_support_x86_avx_vnni_int8())
            has_w_shift = false;
#endif // NCNN_AVXVNNIINT8
    }
    if (has_w_shift)
    {
        int w_shift_count = TILE_M >= 16 ? 16 : TILE_M >= 8 ? 8 : TILE_M >= 4 ? 4 : TILE_M >= 2 ? 2 : 1;
        AT.create((TILE_K + w_shift_count * 4) * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, (size_t)1u, 1);
    }
    else
#endif // NCNN_AVX512VNNI || NCNN_AVXVNNI
    {
        AT.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, (size_t)1u, 1);
    }

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int ppj = 0; ppj < nn_M; ppj++)
    {
        const int i = ppj * TILE_M;

        const int max_ii = std::min((M - i), TILE_M);

        for (int k = 0; k < K; k += TILE_K)
        {
            const int max_kk = std::min((K - k), TILE_K);

            Mat AT_tile = AT.channel(i / TILE_M).row_range(k / TILE_K, 1);

            convolution_im2col_pack_A_tile_int8(A_data, AT_tile, i, max_ii, k, max_kk);
        }
    }
}